

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O3

EC_T_BOOL PrintSlaveInfos(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog)

{
  T_eEtherCAT_Vendor TVar1;
  T_eEtherCAT_ProductCode TVar2;
  byte bVar3;
  int iVar4;
  EC_T_CHAR *pEVar5;
  char *pcVar6;
  short sVar7;
  ulong uVar8;
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  ushort local_180;
  ushort local_17e;
  T_eEtherCAT_Vendor local_174;
  T_eEtherCAT_ProductCode local_170;
  uint local_16c;
  uint local_168;
  byte local_164;
  byte local_163;
  ushort local_162;
  ushort local_15c;
  ushort local_15a;
  int local_148;
  undefined1 local_128 [112];
  ushort local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  int local_a8;
  uint local_a4;
  int local_a0;
  uint local_9c;
  int local_98;
  uint local_94;
  int local_90;
  uint local_8c;
  int local_88;
  uint local_84;
  int local_80;
  uint local_7c;
  int local_78;
  
  uVar8 = 0;
  sVar7 = 0;
  do {
    iVar4 = emGetBusSlaveInfo(dwInstanceID,0,sVar7,&local_194);
    if (iVar4 != 0) {
      return 1;
    }
    CAtEmLogging::LogMsg
              (poLog,
               "******************************************************************************");
    CAtEmLogging::LogMsg(poLog,"Slave ID............: 0x%08X",(ulong)local_194);
    CAtEmLogging::LogMsg(poLog,"Bus Index...........: %d",uVar8);
    CAtEmLogging::LogMsg(poLog,"Bus AutoInc Address.: 0x%04x",(ulong)local_17e);
    CAtEmLogging::LogMsg(poLog,"Bus Station Address.: 0x%04x (%4d)",(ulong)local_15c);
    CAtEmLogging::LogMsg(poLog,"Bus Alias Address...: 0x%04x (%4d)",(ulong)local_15a);
    TVar1 = local_174;
    pEVar5 = SlaveVendorText(local_174);
    CAtEmLogging::LogMsg(poLog,"Vendor ID...........: 0x%08X = %s",(ulong)TVar1,pEVar5);
    TVar2 = local_170;
    pEVar5 = SlaveProdCodeText(local_174,local_170);
    CAtEmLogging::LogMsg(poLog,"Product Code........: 0x%08X = %s",(ulong)TVar2,pEVar5);
    CAtEmLogging::LogMsg
              (poLog,"Revision............: 0x%08X   Serial Number: %d",(ulong)local_16c,
               (ulong)local_168);
    bVar3 = local_164;
    pEVar5 = ESCTypeText(local_164);
    CAtEmLogging::LogMsg
              (poLog,"ESC Type............: %s (0x%x)  Revision: %d  Build: %d",pEVar5,(ulong)bVar3,
               (ulong)local_163,(ulong)local_162);
    pcVar6 = "yes";
    if ((local_180 & 1) == 0) {
      pcVar6 = "no ";
    }
    CAtEmLogging::LogMsg(poLog,"Connection at Port A: %s (to 0x%08X)",pcVar6,(ulong)local_190);
    pcVar6 = "yes";
    if ((local_180 & 8) == 0) {
      pcVar6 = "no ";
    }
    CAtEmLogging::LogMsg(poLog,"Connection at Port D: %s (to 0x%08X)",pcVar6,(ulong)local_184);
    pcVar6 = "yes";
    if ((local_180 & 2) == 0) {
      pcVar6 = "no ";
    }
    CAtEmLogging::LogMsg(poLog,"Connection at Port B: %s (to 0x%08X)",pcVar6,(ulong)local_18c);
    pcVar6 = "yes";
    if ((local_180 & 4) == 0) {
      pcVar6 = "no ";
    }
    CAtEmLogging::LogMsg(poLog,"Connection at Port C: %s (to 0x%08X)",pcVar6,(ulong)local_188);
    pcVar6 = "yes";
    if (local_148 == 0) {
      pcVar6 = "no ";
    }
    CAtEmLogging::LogMsg(poLog,"Line Crossed........: %s",pcVar6);
    iVar4 = emGetCfgSlaveInfo(dwInstanceID,1,local_15c,local_128);
    if (iVar4 == 0) {
      CAtEmLogging::LogMsg(poLog,"Cfg Station Address.: 0x%04x (%4d)",(ulong)local_b8);
      if (local_b0 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN    Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_b4 >> 3),
                   (ulong)(local_b4 & 7));
      }
      if (local_a8 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT   Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_ac >> 3),
                   (ulong)(local_ac & 7));
      }
      if (local_a0 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  2 Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_a4 >> 3),
                   (ulong)(local_a4 & 7));
      }
      if (local_98 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 2 Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_9c >> 3),
                   (ulong)(local_9c & 7));
      }
      if (local_90 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  3 Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_94 >> 3),
                   (ulong)(local_94 & 7));
      }
      if (local_88 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 3 Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_8c >> 3),
                   (ulong)(local_8c & 7));
      }
      if (local_80 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  4 Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_84 >> 3),
                   (ulong)(local_84 & 7));
      }
      if (local_78 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 4 Byte.Bit offset: %d.%d   Size: %d bits",(ulong)(local_7c >> 3),
                   (ulong)(local_7c & 7));
      }
    }
    sVar7 = sVar7 + -1;
    uVar8 = (ulong)((int)uVar8 + 1);
  } while (sVar7 != 1);
  return 1;
}

Assistant:

EC_T_BOOL PrintSlaveInfos
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog)
{
EC_T_DWORD dwRes           = EC_E_ERROR;
EC_T_WORD  wAutoIncAddress = 0;

    /* get information about all bus slaves */
    for (wAutoIncAddress = 0; wAutoIncAddress != 1; wAutoIncAddress--)
    {
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
    EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;

        /* get bus slave information */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            break;
        }
        LogMsg("******************************************************************************");
        LogMsg("Slave ID............: 0x%08X", oBusSlaveInfo.dwSlaveId);
        LogMsg("Bus Index...........: %d", (EC_T_WORD)(0-wAutoIncAddress));
        LogMsg("Bus AutoInc Address.: 0x%04x",       oBusSlaveInfo.wAutoIncAddress, oBusSlaveInfo.wAutoIncAddress);
        LogMsg("Bus Station Address.: 0x%04x (%4d)", oBusSlaveInfo.wStationAddress, oBusSlaveInfo.wStationAddress);
        LogMsg("Bus Alias Address...: 0x%04x (%4d)", oBusSlaveInfo.wAliasAddress,   oBusSlaveInfo.wAliasAddress);
        LogMsg("Vendor ID...........: 0x%08X = %s", oBusSlaveInfo.dwVendorId, SlaveVendorText((T_eEtherCAT_Vendor)oBusSlaveInfo.dwVendorId));
        LogMsg("Product Code........: 0x%08X = %s", oBusSlaveInfo.dwProductCode, SlaveProdCodeText((T_eEtherCAT_Vendor)oBusSlaveInfo.dwVendorId, (T_eEtherCAT_ProductCode)oBusSlaveInfo.dwProductCode));
        LogMsg("Revision............: 0x%08X   Serial Number: %d", oBusSlaveInfo.dwRevisionNumber, oBusSlaveInfo.dwSerialNumber);
        LogMsg("ESC Type............: %s (0x%x)  Revision: %d  Build: %d", ESCTypeText(oBusSlaveInfo.byESCType), oBusSlaveInfo.byESCType, oBusSlaveInfo.byESCRevision, oBusSlaveInfo.wESCBuild);
        LogMsg("Connection at Port A: %s (to 0x%08X)", ((1<<0)==(oBusSlaveInfo.wPortState & (1<<0)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[0]);
        LogMsg("Connection at Port D: %s (to 0x%08X)", ((1<<3)==(oBusSlaveInfo.wPortState & (1<<3)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[3]);
        LogMsg("Connection at Port B: %s (to 0x%08X)", ((1<<1)==(oBusSlaveInfo.wPortState & (1<<1)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[1]);
        LogMsg("Connection at Port C: %s (to 0x%08X)", ((1<<2)==(oBusSlaveInfo.wPortState & (1<<2)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[2]);
        LogMsg("Line Crossed........: %s", (oBusSlaveInfo.bLineCrossed)? "yes": "no ");

        /* get cfg slave information (matching bus slave) */
        dwRes = emGetCfgSlaveInfo(dwInstanceID, EC_TRUE, oBusSlaveInfo.wStationAddress, &oCfgSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            continue;
        }
        LogMsg("Cfg Station Address.: 0x%04x (%4d)", oCfgSlaveInfo.wStationAddress, oCfgSlaveInfo.wStationAddress);
        if (0 != oCfgSlaveInfo.dwPdSizeIn)
        {
            LogMsg("PD IN    Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn/8,  oCfgSlaveInfo.dwPdOffsIn%8,  oCfgSlaveInfo.dwPdSizeIn);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut)
        {
            LogMsg("PD OUT   Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut/8, oCfgSlaveInfo.dwPdOffsOut%8, oCfgSlaveInfo.dwPdSizeOut);
        }

        if (0 != oCfgSlaveInfo.dwPdSizeIn2)
        {
            LogMsg("PD IN  2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn2/8,  oCfgSlaveInfo.dwPdOffsIn2%8,  oCfgSlaveInfo.dwPdSizeIn2);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut2)
        {
            LogMsg("PD OUT 2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut2/8, oCfgSlaveInfo.dwPdOffsOut2%8, oCfgSlaveInfo.dwPdSizeOut2);
        }

        if (0 != oCfgSlaveInfo.dwPdSizeIn3)
        {
            LogMsg("PD IN  3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn3/8,  oCfgSlaveInfo.dwPdOffsIn3%8,  oCfgSlaveInfo.dwPdSizeIn3);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut3)
        {
            LogMsg("PD OUT 3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut3/8, oCfgSlaveInfo.dwPdOffsOut3%8, oCfgSlaveInfo.dwPdSizeOut3);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeIn4)
        {
            LogMsg("PD IN  4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn4/8,  oCfgSlaveInfo.dwPdOffsIn4%8,  oCfgSlaveInfo.dwPdSizeIn4);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut4)
        {
            LogMsg("PD OUT 4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut4/8, oCfgSlaveInfo.dwPdOffsOut4%8, oCfgSlaveInfo.dwPdSizeOut4);
        }
    }
    return EC_TRUE;
}